

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeglobals.cpp
# Opt level: O0

void __thiscall QMakeGlobals::~QMakeGlobals(QMakeGlobals *this)

{
  QHash<QMakeBaseKey,_QMakeBaseEnv_*> *in_RDI;
  QHash<QMakeBaseKey,_QMakeBaseEnv_*> *in_stack_fffffffffffffff0;
  QHash<QMakeBaseKey,_QMakeBaseEnv_*> *pQVar1;
  
  qDeleteAll<QHash<QMakeBaseKey,QMakeBaseEnv*>>(in_stack_fffffffffffffff0);
  QHash<QMakeBaseKey,_QMakeBaseEnv_*>::~QHash(in_RDI);
  QString::~QString((QString *)0x30ab85);
  QString::~QString((QString *)0x30ab96);
  pQVar1 = in_RDI + 0x2e;
  do {
    pQVar1 = pQVar1 + -3;
    QString::~QString((QString *)0x30abc1);
  } while (pQVar1 != in_RDI + 0x22);
  QString::~QString((QString *)0x30abe5);
  QString::~QString((QString *)0x30abf6);
  QString::~QString((QString *)0x30ac07);
  QString::~QString((QString *)0x30ac18);
  QString::~QString((QString *)0x30ac29);
  QList<QString>::~QList((QList<QString> *)0x30ac3a);
  QList<QString>::~QList((QList<QString> *)0x30ac48);
  QString::~QString((QString *)0x30ac56);
  QString::~QString((QString *)0x30ac64);
  QString::~QString((QString *)0x30ac72);
  QString::~QString((QString *)0x30ac80);
  return;
}

Assistant:

QMakeGlobals::~QMakeGlobals()
{
    qDeleteAll(baseEnvs);
}